

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O1

string * __thiscall
duckdb::BaseStatistics::ToString_abi_cxx11_(string *__return_storage_ptr__,BaseStatistics *this)

{
  bool bVar1;
  bool bVar2;
  idx_t iVar3;
  StatisticsType SVar4;
  long *plVar5;
  char *params;
  long *plVar6;
  string *msg;
  BaseStatistics *stats;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  Exception local_90;
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  bVar1 = this->has_null;
  bVar2 = this->has_no_null;
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"%s%s","");
  local_90._0_8_ = local_80;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"[Has Null: %s, Has No Null: %s]","");
  msg = (string *)0x1e3612f;
  params = "false";
  if (bVar2 != false) {
    params = "true";
  }
  if (bVar1 != false) {
    msg = (string *)0x1e44ccd;
  }
  Exception::ConstructMessage<char_const*,char_const*>(&local_50,&local_90,msg,params,(char *)in_R8)
  ;
  iVar3 = this->distinct_count;
  if (iVar3 == 0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,anon_var_dwarf_63b5960 + 9);
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"[Approx Unique: %lld]","");
    Exception::ConstructMessage<unsigned_long>(&local_d0,&local_b0,this->distinct_count);
  }
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_70,&local_50,&local_d0,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((iVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((undefined1 *)local_90._0_8_ != local_80) {
    operator_delete((void *)local_90._0_8_);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  SVar4 = GetStatsType(&this->type);
  switch(SVar4) {
  case NUMERIC_STATS:
    NumericStats::ToString_abi_cxx11_(&local_110,(NumericStats *)this,stats);
    plVar5 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p
                               );
    break;
  case STRING_STATS:
    StringStats::ToString_abi_cxx11_(&local_110,(StringStats *)this,stats);
    plVar5 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p
                               );
    break;
  case LIST_STATS:
    ListStats::ToString_abi_cxx11_(&local_110,(ListStats *)this,stats);
    plVar5 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p
                               );
    break;
  case STRUCT_STATS:
    StructStats::ToString_abi_cxx11_(&local_110,(StructStats *)this,stats);
    plVar5 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p
                               );
    break;
  default:
    goto switchD_010e3e1b_caseD_4;
  case ARRAY_STATS:
    ArrayStats::ToString_abi_cxx11_(&local_110,(ArrayStats *)this,stats);
    plVar5 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p
                               );
  }
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_e0 = *plVar6;
    lStack_d8 = plVar5[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar6;
    local_f0 = (long *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
switchD_010e3e1b_caseD_4:
  return __return_storage_ptr__;
}

Assistant:

string BaseStatistics::ToString() const {
	auto has_n = has_null ? "true" : "false";
	auto has_n_n = has_no_null ? "true" : "false";
	string result =
	    StringUtil::Format("%s%s", StringUtil::Format("[Has Null: %s, Has No Null: %s]", has_n, has_n_n),
	                       distinct_count > 0 ? StringUtil::Format("[Approx Unique: %lld]", distinct_count) : "");
	switch (GetStatsType()) {
	case StatisticsType::NUMERIC_STATS:
		result = NumericStats::ToString(*this) + result;
		break;
	case StatisticsType::STRING_STATS:
		result = StringStats::ToString(*this) + result;
		break;
	case StatisticsType::LIST_STATS:
		result = ListStats::ToString(*this) + result;
		break;
	case StatisticsType::STRUCT_STATS:
		result = StructStats::ToString(*this) + result;
		break;
	case StatisticsType::ARRAY_STATS:
		result = ArrayStats::ToString(*this) + result;
		break;
	default:
		break;
	}
	return result;
}